

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::computeDualInfeasInPrimal(HModel *this,int *dualInfeasCount)

{
  double dVar1;
  pointer pdVar2;
  long lVar3;
  int iVar4;
  
  if ((long)this->numTot < 1) {
    iVar4 = 0;
  }
  else {
    pdVar2 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    iVar4 = 0;
    do {
      if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] != 0) {
        dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if ((((dVar1 == -1e+200) && (!NAN(dVar1))) &&
            (dVar1 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar3], dVar1 == 1e+200)) && (!NAN(dVar1))) {
          iVar4 = (iVar4 + 1) - (uint)(ABS(pdVar2[lVar3]) < this->dblOption[2]);
        }
        iVar4 = (iVar4 + 1) -
                (uint)(-this->dblOption[2] <
                      (double)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar3] * pdVar2[lVar3]);
      }
      lVar3 = lVar3 + 1;
    } while (this->numTot != lVar3);
  }
  *dualInfeasCount = iVar4;
  return;
}

Assistant:

void HModel::computeDualInfeasInPrimal(int *dualInfeasCount) {
    int workCount = 0;
    const double inf = HSOL_CONST_INF;
    const double tau_d = dblOption[DBLOPT_DUAL_TOL];
    for (int i = 0; i < numTot; i++) {
        // Only for non basic variables
        if (!nonbasicFlag[i])
            continue;
        // Free
        if (workLower[i] == -inf && workUpper[i] == inf)
            workCount += (fabs(workDual[i]) >= tau_d);
        // In primal don't assume flip
        workCount += (nonbasicMove[i] * workDual[i] <= -tau_d);
    }
    *dualInfeasCount = workCount;
}